

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

Value * anon_unknown.dwarf_7ef79c::ReadJson(Value *__return_storage_ptr__,string *jsonstr)

{
  optional<(anonymous_namespace)::Args> errorPath;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  uint uVar1;
  Value *this;
  CharReader *__p;
  pointer pCVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  json_error *this_00;
  _Storage<(anonymous_namespace)::Args,_true> local_130;
  undefined8 local_120;
  string_view local_118;
  string_view local_108;
  undefined1 local_f8 [16];
  iterator local_e8;
  size_type local_e0;
  string local_d8 [8];
  string error;
  unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> local_b0;
  unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> jsonReader;
  String local_a0;
  Value local_70;
  undefined1 local_48 [8];
  CharReaderBuilder builder;
  string *jsonstr_local;
  Value *json;
  
  builder.settings_.limit_ = (ptrdiff_t)jsonstr;
  Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)local_48);
  Json::Value::Value(&local_70,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"collectComments",
             (allocator<char> *)
             ((long)&jsonReader._M_t.
                     super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>
                     .super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl + 7));
  this = Json::CharReaderBuilder::operator[]((CharReaderBuilder *)local_48,&local_a0);
  Json::Value::operator=(this,&local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&jsonReader._M_t.
                     super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>
                     .super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl + 7));
  Json::Value::~Value(&local_70);
  __p = Json::CharReaderBuilder::newCharReader((CharReaderBuilder *)local_48);
  std::unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>>::
  unique_ptr<std::default_delete<Json::CharReader>,void>
            ((unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>> *)&local_b0,__p);
  error.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,nullValue);
  std::__cxx11::string::string(local_d8);
  pCVar2 = std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::operator->
                     (&local_b0);
  uVar3 = std::__cxx11::string::data();
  lVar4 = std::__cxx11::string::data();
  lVar5 = std::__cxx11::string::size();
  uVar1 = (*pCVar2->_vptr_CharReader[2])(pCVar2,uVar3,lVar4 + lVar5,__return_storage_ptr__,local_d8)
  ;
  if ((uVar1 & 1) == 0) {
    this_00 = (json_error *)__cxa_allocate_exception(0x28);
    local_118 = (string_view)::cm::operator____s("failed parsing json string: ",0x1c);
    local_108 = local_118;
    local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_d8);
    local_e8 = &local_108;
    local_e0 = 2;
    std::optional<(anonymous_namespace)::Args>::optional
              ((optional<(anonymous_namespace)::Args> *)&local_130);
    message._M_len = local_e0;
    message._M_array = local_e8;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         local_130._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         local_130._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .Begin._M_current;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_120;
    json_error::json_error(this_00,message,errorPath);
    __cxa_throw(this_00,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  error.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_d8);
  if ((error.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::~unique_ptr(&local_b0);
  Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Json::Value ReadJson(const std::string& jsonstr)
{
  Json::CharReaderBuilder builder;
  builder["collectComments"] = false;
  auto jsonReader = std::unique_ptr<Json::CharReader>(builder.newCharReader());
  Json::Value json;
  std::string error;
  if (!jsonReader->parse(jsonstr.data(), jsonstr.data() + jsonstr.size(),
                         &json, &error)) {
    throw json_error({ "failed parsing json string: "_s, error });
  }
  return json;
}